

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O3

string * PrintStringToBIO_abi_cxx11_
                   (string *__return_storage_ptr__,ASN1_STRING *str,
                   _func_int_BIO_ptr_ASN1_STRING_ptr *print_func)

{
  int iVar1;
  BIO_METHOD *type;
  string *extraout_RAX;
  UniquePtr<BIO> bio;
  size_t len;
  uint8_t *data;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  _Head_base<0UL,_bio_st_*,_false> local_30;
  size_t local_28;
  uint8_t *local_20;
  
  type = BIO_s_mem();
  local_30._M_head_impl = (bio_st *)BIO_new(type);
  if ((BIO *)local_30._M_head_impl != (BIO *)0x0) {
    iVar1 = (*print_func)(local_30._M_head_impl,str);
    if (iVar1 != 0) {
      iVar1 = BIO_mem_contents(local_30._M_head_impl,&local_20,&local_28);
      if (iVar1 != 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)__return_storage_ptr__,local_20,local_20 + local_28);
        goto LAB_001c81f2;
      }
    }
  }
  testing::Message::Message((Message *)&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_40._M_head_impl + 0x10),"Could not print to BIO",0x16);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
             ,0x3d1,"Failed");
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_001c81f2:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_30);
  return extraout_RAX;
}

Assistant:

static std::string PrintStringToBIO(const ASN1_STRING *str,
                                    int (*print_func)(BIO *,
                                                      const ASN1_STRING *)) {
  const uint8_t *data;
  size_t len;
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
  if (!bio ||  //
      !print_func(bio.get(), str) ||
      !BIO_mem_contents(bio.get(), &data, &len)) {
    ADD_FAILURE() << "Could not print to BIO";
    return "";
  }
  return std::string(data, data + len);
}